

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseProcess.cpp
# Opt level: O0

void __thiscall Assimp::BaseProcess::ExecuteOnScene(BaseProcess *this,Importer *pImp)

{
  ImporterPimpl *pIVar1;
  ProgressHandler *pPVar2;
  bool bVar3;
  exception *err;
  Importer *pImp_local;
  BaseProcess *this_local;
  
  bVar3 = false;
  if (pImp != (Importer *)0x0) {
    pIVar1 = Importer::Pimpl(pImp);
    bVar3 = pIVar1->mScene != (aiScene *)0x0;
  }
  if (!bVar3) {
    __assert_fail("__null != pImp && __null != pImp->Pimpl()->mScene",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/BaseProcess.cpp"
                  ,0x48,"void Assimp::BaseProcess::ExecuteOnScene(Importer *)");
  }
  pPVar2 = Importer::GetProgressHandler(pImp);
  this->progress = pPVar2;
  if (this->progress != (ProgressHandler *)0x0) {
    (*this->_vptr_BaseProcess[4])(this,pImp);
    pIVar1 = Importer::Pimpl(pImp);
    (*this->_vptr_BaseProcess[5])(this,pIVar1->mScene);
    return;
  }
  __assert_fail("progress",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/BaseProcess.cpp"
                ,0x4b,"void Assimp::BaseProcess::ExecuteOnScene(Importer *)");
}

Assistant:

void BaseProcess::ExecuteOnScene( Importer* pImp)
{
    ai_assert(NULL != pImp && NULL != pImp->Pimpl()->mScene);

    progress = pImp->GetProgressHandler();
    ai_assert(progress);

    SetupProperties( pImp );

    // catch exceptions thrown inside the PostProcess-Step
    try
    {
        Execute(pImp->Pimpl()->mScene);

    } catch( const std::exception& err )    {

        // extract error description
        pImp->Pimpl()->mErrorString = err.what();
        ASSIMP_LOG_ERROR(pImp->Pimpl()->mErrorString);

        // and kill the partially imported data
        delete pImp->Pimpl()->mScene;
        pImp->Pimpl()->mScene = nullptr;
    }
}